

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O1

int re2::PCRE::GlobalReplace(string *str,PCRE *pattern,StringPiece *rewrite)

{
  bool bVar1;
  uint veclen;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar2;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  bool bVar3;
  PCRE *out_00;
  PCRE *this;
  int *in_R9;
  uint uVar4;
  int iVar5;
  string out;
  int vec [51];
  undefined1 local_140 [40];
  StringPiece local_118;
  uint local_108;
  uint local_104;
  
  uVar4 = 0;
  out_00 = (PCRE *)0x0;
  local_140._32_8_ = rewrite;
  memset(&local_108,0,0xcc);
  local_140._0_8_ = local_140 + 0x10;
  local_140._8_8_ = 0;
  local_140[0x10] = '\0';
  bVar3 = false;
  iVar5 = 0;
  uVar2 = extraout_RDX;
  do {
    if ((int)str->_M_string_length < (int)uVar4) break;
    if (bVar3) {
      veclen = TryMatch(pattern,(StringPiece *)out_00,(int)uVar2,ANCHOR_START,false,in_R9,0x33);
      if ((int)veclen < 1) {
        uVar2 = extraout_RDX_00;
        if ((int)uVar4 < (int)str->_M_string_length) {
          out_00 = (PCRE *)(ulong)(uint)(int)(str->_M_dataplus)._M_p[uVar4];
          std::__cxx11::string::push_back((char)local_140);
          uVar2 = extraout_RDX_01;
        }
        bVar1 = false;
        uVar4 = uVar4 + 1;
        bVar3 = false;
      }
      else {
LAB_00120c6a:
        if ((int)local_108 < (int)uVar4) {
          __assert_fail("matchstart >= start",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc"
                        ,0x1a3,
                        "static int re2::PCRE::GlobalReplace(string *, const PCRE &, const StringPiece &)"
                       );
        }
        if ((int)local_104 < (int)local_108) {
          __assert_fail("matchend >= matchstart",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc"
                        ,0x1a4,
                        "static int re2::PCRE::GlobalReplace(string *, const PCRE &, const StringPiece &)"
                       );
        }
        out_00 = (PCRE *)local_140;
        this = out_00;
        std::__cxx11::string::append((string *)out_00,(ulong)str,(ulong)uVar4);
        local_118.ptr_ = (str->_M_dataplus)._M_p;
        local_118.length_ = (int)str->_M_string_length;
        in_R9 = (int *)(ulong)veclen;
        Rewrite(this,(string *)out_00,(StringPiece *)local_140._32_8_,&local_118,(int *)&local_108,
                veclen);
        iVar5 = iVar5 + 1;
        bVar1 = false;
        uVar2 = extraout_RDX_03;
        uVar4 = local_104;
        bVar3 = local_108 == local_104;
      }
    }
    else {
      veclen = TryMatch(pattern,(StringPiece *)out_00,(int)uVar2,UNANCHORED,false,in_R9,0x33);
      if (0 < (int)veclen) goto LAB_00120c6a;
      bVar1 = true;
      uVar2 = extraout_RDX_02;
    }
  } while (!bVar1);
  if (iVar5 == 0) {
    iVar5 = 0;
  }
  else {
    if ((int)uVar4 < (int)str->_M_string_length) {
      std::__cxx11::string::append((string *)local_140,(ulong)str,(ulong)uVar4);
    }
    std::__cxx11::string::swap((string *)local_140);
  }
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_);
  }
  return iVar5;
}

Assistant:

int PCRE::GlobalReplace(string *str,
                      const PCRE& pattern,
                      const StringPiece& rewrite) {
  int count = 0;
  int vec[kVecSize] = {};
  string out;
  int start = 0;
  bool last_match_was_empty_string = false;

  while (start <= static_cast<int>(str->size())) {
    // If the previous match was for the empty string, we shouldn't
    // just match again: we'll match in the same way and get an
    // infinite loop.  Instead, we do the match in a special way:
    // anchored -- to force another try at the same position --
    // and with a flag saying that this time, ignore empty matches.
    // If this special match returns, that means there's a non-empty
    // match at this position as well, and we can continue.  If not,
    // we do what perl does, and just advance by one.
    // Notice that perl prints '@@@' for this;
    //    perl -le '$_ = "aa"; s/b*|aa/@/g; print'
    int matches;
    if (last_match_was_empty_string) {
      matches = pattern.TryMatch(*str, start, ANCHOR_START, false,
                                 vec, kVecSize);
      if (matches <= 0) {
        if (start < static_cast<int>(str->size()))
          out.push_back((*str)[start]);
        start++;
        last_match_was_empty_string = false;
        continue;
      }
    } else {
      matches = pattern.TryMatch(*str, start, UNANCHORED, true,
                                 vec, kVecSize);
      if (matches <= 0)
        break;
    }
    int matchstart = vec[0], matchend = vec[1];
    assert(matchstart >= start);
    assert(matchend >= matchstart);

    out.append(*str, start, matchstart - start);
    pattern.Rewrite(&out, rewrite, *str, vec, matches);
    start = matchend;
    count++;
    last_match_was_empty_string = (matchstart == matchend);
  }

  if (count == 0)
    return 0;

  if (start < static_cast<int>(str->size()))
    out.append(*str, start, static_cast<int>(str->size()) - start);
  swap(out, *str);
  return count;
}